

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

void upb_Array_Delete(upb_Array *arr,size_t i,size_t count)

{
  uint __line;
  ulong src_idx;
  char *__assertion;
  
  if ((arr->data_dont_copy_me__upb_internal_use_only & 4) == 0) {
    src_idx = count + i;
    if (CARRY8(count,i)) {
      __assertion = "i <= end";
      __line = 0x61;
    }
    else {
      if (src_idx <= arr->size_dont_copy_me__upb_internal_use_only) {
        upb_Array_Move(arr,i,src_idx,arr->size_dont_copy_me__upb_internal_use_only - src_idx);
        arr->size_dont_copy_me__upb_internal_use_only =
             arr->size_dont_copy_me__upb_internal_use_only - count;
        return;
      }
      __assertion = "end <= arr->size_dont_copy_me__upb_internal_use_only";
      __line = 0x62;
    }
  }
  else {
    __assertion = "!upb_Array_IsFrozen(arr)";
    __line = 0x5f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                ,__line,"void upb_Array_Delete(upb_Array *, size_t, size_t)");
}

Assistant:

void upb_Array_Delete(upb_Array* arr, size_t i, size_t count) {
  UPB_ASSERT(!upb_Array_IsFrozen(arr));
  const size_t end = i + count;
  UPB_ASSERT(i <= end);
  UPB_ASSERT(end <= arr->UPB_PRIVATE(size));
  upb_Array_Move(arr, i, end, arr->UPB_PRIVATE(size) - end);
  arr->UPB_PRIVATE(size) -= count;
}